

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string_t * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::dump(string_t *__return_storage_ptr__,
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
      *this,int indent)

{
  int iVar1;
  undefined8 *puVar2;
  _Impl *this_00;
  bool pretty_print;
  locale local_1c8;
  locale local_1c0;
  stringstream ss;
  undefined8 uStack_1b0;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
      ::dump(int)::loc == '\0') {
    iVar1 = __cxa_guard_acquire(&basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                                 ::dump(int)::loc);
    if (iVar1 != 0) {
      std::locale::locale(&local_1c8);
      puVar2 = (undefined8 *)operator_new(0x18);
      std::__cxx11::numpunct<char>::numpunct((ulong)puVar2);
      *puVar2 = &PTR__numpunct_0011dd20;
      this_00 = (_Impl *)operator_new(0x28);
      std::locale::_Impl::_Impl(this_00,local_1c8._M_impl,1);
      dump::loc._M_impl = this_00;
      std::locale::_Impl::_M_install_facet((id *)this_00,(facet *)&std::__cxx11::numpunct<char>::id)
      ;
      puVar2 = *(undefined8 **)(dump::loc._M_impl + 0x20);
      if ((void *)*puVar2 != (void *)0x0) {
        operator_delete__((void *)*puVar2);
        puVar2 = *(undefined8 **)(dump::loc._M_impl + 0x20);
      }
      *puVar2 = 0;
      std::locale::~locale(&local_1c8);
      __cxa_atexit(std::locale::~locale,&dump::loc,&__dso_handle);
      __cxa_guard_release(&basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                           ::dump(int)::loc);
    }
  }
  std::ios::imbue(&local_1c0);
  std::locale::~locale(&local_1c0);
  *(undefined8 *)((long)&uStack_1b0 + *(long *)(_ss + -0x18)) = 0xf;
  pretty_print = -1 < indent;
  if (!pretty_print) {
    indent = 0;
  }
  dump(this,local_1a8,pretty_print,indent,0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string_t dump(const int indent = -1) const
    {
        std::stringstream ss;
        // fix locale problems
        const static std::locale loc(std::locale(), new DecimalSeparator);
        ss.imbue(loc);

        // 6, 15 or 16 digits of precision allows round-trip IEEE 754
        // string->float->string, string->double->string or string->long
        // double->string; to be safe, we read this value from
        // std::numeric_limits<number_float_t>::digits10
        ss.precision(std::numeric_limits<double>::digits10);

        if (indent >= 0)
        {
            dump(ss, true, static_cast<unsigned int>(indent));
        }
        else
        {
            dump(ss, false, 0);
        }

        return ss.str();
    }